

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O1

boolean compress_data(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  jpeg_c_coef_controller *pjVar1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  int iVar4;
  int iVar5;
  jpeg_c_coef_controller *pjVar6;
  jpeg_component_info *pjVar7;
  _func_boolean_j_compress_ptr_JSAMPIMAGE *p_Var8;
  boolean bVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  JDIMENSION JVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  
  pjVar6 = cinfo->coef;
  iVar11 = *(int *)&pjVar6[1].compress_data;
  if (iVar11 < *(int *)((long)&pjVar6[1].compress_data + 4)) {
    JVar2 = cinfo->total_iMCU_rows;
    uVar10 = cinfo->MCUs_per_row - 1;
    pjVar1 = pjVar6 + 2;
    do {
      uVar17 = *(uint *)((long)&pjVar6[1].start_pass + 4);
      if (uVar17 <= uVar10) {
        do {
          if (0 < cinfo->comps_in_scan) {
            lVar13 = 0;
            iVar16 = 0;
            do {
              pjVar7 = cinfo->cur_comp_info[lVar13];
              if (0 < pjVar7->MCU_height) {
                JVar3 = (&pjVar7->MCU_width)[(ulong)(uVar10 <= uVar17) * 4];
                iVar4 = pjVar7->MCU_sample_width;
                iVar14 = 0;
                JVar15 = iVar11 * 8;
                do {
                  lVar18 = (long)iVar16;
                  if ((*(uint *)&pjVar6[1].start_pass < JVar2 - 1) ||
                     (iVar11 + iVar14 < pjVar7->last_row_height)) {
                    (*cinfo->fdct->forward_DCT)
                              (cinfo,pjVar7,input_buf[pjVar7->component_index],
                               (JBLOCKROW)(&pjVar6[2].start_pass)[lVar18],JVar15,iVar4 * uVar17,
                               JVar3);
                    if ((int)JVar3 < pjVar7->MCU_width) {
                      jzero_far((&pjVar6[2].start_pass)[(int)(iVar16 + JVar3)],
                                (long)(int)(pjVar7->MCU_width - JVar3) << 7);
                      iVar5 = pjVar7->MCU_width;
                      lVar12 = (long)(int)JVar3;
                      if ((int)JVar3 < iVar5) {
                        do {
                          (*(JBLOCKROW)(&pjVar1->start_pass)[lVar18 + lVar12])[0] =
                               **(JCOEF **)((long)pjVar1 + lVar12 * 8 + lVar18 * 8 + -8);
                          lVar12 = lVar12 + 1;
                        } while (iVar5 != lVar12);
                      }
                    }
                  }
                  else {
                    jzero_far((&pjVar6[2].start_pass)[lVar18],(long)pjVar7->MCU_width << 7);
                    iVar5 = pjVar7->MCU_width;
                    if (0 < (long)iVar5) {
                      p_Var8 = (&pjVar6[1].compress_data)[lVar18];
                      lVar12 = 0;
                      do {
                        (*(JBLOCKROW)(&pjVar1->start_pass)[lVar18 + lVar12])[0] = *(JCOEF *)p_Var8;
                        lVar12 = lVar12 + 1;
                      } while (iVar5 != lVar12);
                    }
                  }
                  iVar16 = iVar16 + pjVar7->MCU_width;
                  JVar15 = JVar15 + 8;
                  iVar14 = iVar14 + 1;
                } while (iVar14 < pjVar7->MCU_height);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < cinfo->comps_in_scan);
          }
          bVar9 = (*cinfo->entropy->encode_mcu)(cinfo,(JBLOCKROW *)pjVar1);
          if (bVar9 == 0) {
            *(int *)&pjVar6[1].compress_data = iVar11;
            *(uint *)((long)&pjVar6[1].start_pass + 4) = uVar17;
            return 0;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 <= uVar10);
      }
      *(undefined4 *)((long)&pjVar6[1].start_pass + 4) = 0;
      iVar11 = iVar11 + 1;
    } while (iVar11 < *(int *)((long)&pjVar6[1].compress_data + 4));
  }
  *(int *)&pjVar6[1].start_pass = *(int *)&pjVar6[1].start_pass + 1;
  start_iMCU_row(cinfo);
  return 1;
}

Assistant:

METHODDEF(boolean)
compress_data(j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, bi, ci, yindex, yoffset, blockcnt;
  JDIMENSION ypos, xpos;
  jpeg_component_info *compptr;

  /* Loop to write as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num <= last_MCU_col;
         MCU_col_num++) {
      /* Determine where data comes from in input_buf and do the DCT thing.
       * Each call on forward_DCT processes a horizontal row of DCT blocks
       * as wide as an MCU; we rely on having allocated the MCU_buffer[] blocks
       * sequentially.  Dummy blocks at the right or bottom edge are filled in
       * specially.  The data in them does not matter for image reconstruction,
       * so we fill them with values that will encode to the smallest amount of
       * data, viz: all zeroes in the AC entries, DC entries equal to previous
       * block's DC value.  (Thanks to Thomas Kinsman for this idea.)
       */
      blkn = 0;
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
        compptr = cinfo->cur_comp_info[ci];
        blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width :
                                                  compptr->last_col_width;
        xpos = MCU_col_num * compptr->MCU_sample_width;
        ypos = yoffset * DCTSIZE; /* ypos == (yoffset+yindex) * DCTSIZE */
        for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
          if (coef->iMCU_row_num < last_iMCU_row ||
              yoffset + yindex < compptr->last_row_height) {
            (*cinfo->fdct->forward_DCT) (cinfo, compptr,
                                         input_buf[compptr->component_index],
                                         coef->MCU_buffer[blkn],
                                         ypos, xpos, (JDIMENSION)blockcnt);
            if (blockcnt < compptr->MCU_width) {
              /* Create some dummy blocks at the right edge of the image. */
              jzero_far((void *)coef->MCU_buffer[blkn + blockcnt],
                        (compptr->MCU_width - blockcnt) * sizeof(JBLOCK));
              for (bi = blockcnt; bi < compptr->MCU_width; bi++) {
                coef->MCU_buffer[blkn + bi][0][0] =
                  coef->MCU_buffer[blkn + bi - 1][0][0];
              }
            }
          } else {
            /* Create a row of dummy blocks at the bottom of the image. */
            jzero_far((void *)coef->MCU_buffer[blkn],
                      compptr->MCU_width * sizeof(JBLOCK));
            for (bi = 0; bi < compptr->MCU_width; bi++) {
              coef->MCU_buffer[blkn + bi][0][0] =
                coef->MCU_buffer[blkn - 1][0][0];
            }
          }
          blkn += compptr->MCU_width;
          ypos += DCTSIZE;
        }
      }
      /* Try to write the MCU.  In event of a suspension failure, we will
       * re-DCT the MCU on restart (a bit inefficient, could be fixed...)
       */
      if (!(*cinfo->entropy->encode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->mcu_ctr = MCU_col_num;
        return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}